

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void unquote(string *v)

{
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::substr((ulong)local_38,(ulong)v);
  std::__cxx11::string::operator=((string *)v,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void unquote(std::string& v)
{
    v = v.substr(1, v.length() - 2);
}